

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int mutex_unlock_shared(mutex_handle *mutex)

{
  pthread_cond_t *__cond;
  int iVar1;
  int ret;
  mutex_priv *priv;
  mutex_handle *mutex_local;
  
  __cond = (pthread_cond_t *)mutex->priv;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(__cond + 1));
  if (iVar1 == 0) {
    iVar1 = *(int *)((long)__cond + 0x58) + -1;
    *(int *)((long)__cond + 0x58) = iVar1;
    if ((iVar1 == 0) && (iVar1 = pthread_cond_broadcast(__cond), iVar1 != 0)) {
      mutex_local._4_4_ = -iVar1;
      pthread_mutex_unlock((pthread_mutex_t *)(__cond + 1));
    }
    else {
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)(__cond + 1));
      mutex_local._4_4_ = -iVar1;
    }
  }
  else {
    mutex_local._4_4_ = -iVar1;
  }
  return mutex_local._4_4_;
}

Assistant:

int mutex_unlock_shared(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	if (--(priv->readers) <= 0) {
		ret = pthread_cond_broadcast(&priv->cond);
		if (ret != 0) {
			ret = -ret;
			goto mutex_unlock_shared_exit;
		}
	}

	return -pthread_mutex_unlock(&priv->lock);

mutex_unlock_shared_exit:
	pthread_mutex_unlock(&priv->lock);

	return ret;
}